

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::CVFSDir::RenameChild(CVFSDir *this,string *Name,string *NewName)

{
  mutex *__mutex;
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *this_00;
  __type _Var1;
  size_t sVar2;
  value_type Child;
  __shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  string *local_68;
  __shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  local_68 = NewName;
  std::mutex::lock(__mutex);
  sVar2 = Search(this,Name,0,
                 ((long)(this->m_Childs).
                        super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_Childs).
                        super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  this_00 = &this->m_Childs;
  std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &(this_00->
              super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
              )._M_impl.super__Vector_impl_data._M_start[sVar2].
              super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>);
  CVFSNode::Name_abi_cxx11_(&local_50,local_78._M_ptr);
  _Var1 = std::operator==(&local_50,Name);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var1) {
    std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
    erase(this_00,(this_00->
                  super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + sVar2);
    std::__cxx11::string::_M_assign((string *)&(local_78._M_ptr)->m_Name);
    std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_60,&local_78);
    InternalAppendChild(this,(VFSNode *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void RenameChild(const std::string &Name, const std::string &NewName)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                        auto Child = m_Childs[Pos];
                        if(Child->Name() == Name)
                        {
                            m_Childs.erase(m_Childs.begin() + Pos); //Removes the child temporary.
                            Child->m_Name = NewName;

                            InternalAppendChild(Child);
                        }
                    }